

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

void SzAr_Init(CSzAr *p)

{
  CSzAr *p_local;
  
  p->NumPackStreams = 0;
  p->NumFolders = 0;
  p->PackPositions = (UInt64 *)0x0;
  (p->FolderCRCs).Defs = (Byte *)0x0;
  (p->FolderCRCs).Vals = (UInt32 *)0x0;
  p->FoCodersOffsets = (size_t *)0x0;
  p->FoStartPackStreamIndex = (UInt32 *)0x0;
  p->FoToCoderUnpackSizes = (UInt32 *)0x0;
  p->FoToMainUnpackSizeIndex = (Byte *)0x0;
  p->CoderUnpackSizes = (UInt64 *)0x0;
  p->CodersData = (Byte *)0x0;
  return;
}

Assistant:

static void SzAr_Init(CSzAr *p)
{
  p->NumPackStreams = 0;
  p->NumFolders = 0;
  
  p->PackPositions = NULL;
  SzBitUi32s_Init(&p->FolderCRCs);

  p->FoCodersOffsets = NULL;
  p->FoStartPackStreamIndex = NULL;
  p->FoToCoderUnpackSizes = NULL;
  p->FoToMainUnpackSizeIndex = NULL;
  p->CoderUnpackSizes = NULL;

  p->CodersData = NULL;
}